

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O0

int Cut_CutFilterOne(Cut_Man_t *p,Cut_List_t *pSuperList,Cut_Cut_t *pCut)

{
  int iVar1;
  Cut_Cut_t *local_58;
  Cut_Cut_t *local_50;
  uint local_44;
  Cut_Cut_t **ppCStack_40;
  int a;
  Cut_Cut_t **ppTail;
  Cut_Cut_t *pTemp2;
  Cut_Cut_t *pTemp;
  Cut_Cut_t *pCut_local;
  Cut_List_t *pSuperList_local;
  Cut_Man_t *p_local;
  
  local_44 = 2;
  do {
    if ((int)(*(uint *)pCut >> 0x1c) < (int)local_44) {
      local_44 = *(uint *)pCut >> 0x1c;
      while( true ) {
        local_44 = local_44 + 1;
        if ((int)(*(uint *)pCut >> 0x18 & 0xf) < (int)local_44) {
          return 0;
        }
        ppCStack_40 = pSuperList->pHead + (int)local_44;
        pTemp2 = pSuperList->pHead[(int)local_44];
        if (pTemp2 == (Cut_Cut_t *)0x0) {
          local_50 = (Cut_Cut_t *)0x0;
        }
        else {
          local_50 = pTemp2->pNext;
        }
        ppTail = (Cut_Cut_t **)local_50;
        while (pTemp2 != (Cut_Cut_t *)0x0) {
          if ((pTemp2->uSign & pCut->uSign) == pCut->uSign) {
            iVar1 = Cut_CutCheckDominance(pCut,pTemp2);
            if (iVar1 == 0) {
              ppCStack_40 = &pTemp2->pNext;
            }
            else {
              p->nCutsFilter = p->nCutsFilter + 1;
              p->nNodeCuts = p->nNodeCuts + -1;
              if (pSuperList->pHead[(int)local_44] == pTemp2) {
                pSuperList->pHead[(int)local_44] = pTemp2->pNext;
              }
              if (pSuperList->ppTail[(int)local_44] == &pTemp2->pNext) {
                pSuperList->ppTail[(int)local_44] = ppCStack_40;
              }
              *ppCStack_40 = pTemp2->pNext;
              Cut_CutRecycle(p,pTemp2);
            }
          }
          else {
            ppCStack_40 = &pTemp2->pNext;
          }
          pTemp2 = (Cut_Cut_t *)ppTail;
          if (ppTail == (Cut_Cut_t **)0x0) {
            local_58 = (Cut_Cut_t *)0x0;
          }
          else {
            local_58 = ppTail[2];
          }
          ppTail = (Cut_Cut_t **)local_58;
        }
        if (ppCStack_40 != pSuperList->ppTail[(int)local_44]) break;
        if (*ppCStack_40 != (Cut_Cut_t *)0x0) {
          __assert_fail("*ppTail == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                        ,0xcf,"int Cut_CutFilterOne(Cut_Man_t *, Cut_List_t *, Cut_Cut_t *)");
        }
      }
      __assert_fail("ppTail == pSuperList->ppTail[a]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                    ,0xce,"int Cut_CutFilterOne(Cut_Man_t *, Cut_List_t *, Cut_Cut_t *)");
    }
    for (pTemp2 = pSuperList->pHead[(int)local_44]; pTemp2 != (Cut_Cut_t *)0x0;
        pTemp2 = pTemp2->pNext) {
      if (((pTemp2->uSign & pCut->uSign) == pTemp2->uSign) &&
         (iVar1 = Cut_CutCheckDominance(pTemp2,pCut), iVar1 != 0)) {
        p->nCutsFilter = p->nCutsFilter + 1;
        Cut_CutRecycle(p,pCut);
        return 1;
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

static inline int Cut_CutFilterOne( Cut_Man_t * p, Cut_List_t * pSuperList, Cut_Cut_t * pCut )
{
    Cut_Cut_t * pTemp, * pTemp2, ** ppTail;
    int a;

    // check if this cut is filtered out by smaller cuts
    for ( a = 2; a <= (int)pCut->nLeaves; a++ )
    {
        Cut_ListForEachCut( pSuperList->pHead[a], pTemp )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Cut_CutCheckDominance( pTemp, pCut ) )
            {
                p->nCutsFilter++;
                Cut_CutRecycle( p, pCut );
                return 1;
            }
        }
    }

    // filter out other cuts using this one
    for ( a = pCut->nLeaves + 1; a <= (int)pCut->nVarsMax; a++ )
    {
        ppTail = pSuperList->pHead + a;
        Cut_ListForEachCutSafe( pSuperList->pHead[a], pTemp, pTemp2 )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
            {
                ppTail = &pTemp->pNext;
                continue;
            }
            // check containment seriously
            if ( Cut_CutCheckDominance( pCut, pTemp ) )
            {
                p->nCutsFilter++;
                p->nNodeCuts--;
                // move the head
                if ( pSuperList->pHead[a] == pTemp )
                    pSuperList->pHead[a] = pTemp->pNext;
                // move the tail
                if ( pSuperList->ppTail[a] == &pTemp->pNext )
                    pSuperList->ppTail[a] = ppTail;
                // skip the given cut in the list
                *ppTail = pTemp->pNext;
                // recycle pTemp
                Cut_CutRecycle( p, pTemp );
            }
            else
                ppTail = &pTemp->pNext;
        }
        assert( ppTail == pSuperList->ppTail[a] );
        assert( *ppTail == NULL );
    }

    return 0;
}